

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  Fl_Window *w;
  FILE *__stream;
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  Fl_Plugin *pFVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar8;
  char (*pacVar9) [2048];
  undefined4 in_register_0000003c;
  char *pcVar10;
  Fl_Widget *__stat_loc;
  Fl_Window *c;
  int iVar11;
  int iVar12;
  int i;
  Fl_Plugin_Manager pm;
  
  pcVar10 = (char *)CONCAT44(in_register_0000003c,argc);
  i = 1;
  pacVar9 = (char (*) [2048])argv;
  iVar1 = Fl::args(argc,argv,&i,arg);
  if ((iVar1 == 0) || (i < argc + -1)) {
    sVar5 = strlen(*argv);
    sVar6 = strlen(
                  " -bg2 color\n -bg color\n -di[splay] host:n.n\n -dn[d]\n -fg color\n -g[eometry] WxH+X+Y\n -i[conic]\n -k[bd]\n -na[me] classname\n -nod[nd]\n -nok[bd]\n -not[ooltips]\n -s[cheme] scheme\n -ti[tle] windowtitle\n -to[oltips]"
                  );
    Fl_Plugin_Manager::Fl_Plugin_Manager
              ((Fl_Plugin_Manager *)&pm.super_Fl_Preferences,"commandline");
    iVar1 = Fl_Preferences::groups(&pm.super_Fl_Preferences);
    iVar11 = (int)sVar5 + (int)sVar6 + 0x142;
    iVar12 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar12; iVar12 = iVar12 + 1) {
      pFVar7 = Fl_Plugin_Manager::plugin(&pm,iVar12);
      if (pFVar7 != (Fl_Plugin *)0x0) {
        iVar2 = (*pFVar7->_vptr_Fl_Plugin[4])(pFVar7);
        sVar5 = strlen((char *)CONCAT44(extraout_var,iVar2));
        iVar11 = iVar11 + (int)sVar5;
      }
    }
    pcVar10 = (char *)malloc((long)(iVar11 + 1));
    sprintf(pcVar10,
            "usage: %s <switches> name.fl\n -u : update .fl file and exit (may be combined with \'-c\' or \'-cs\')\n -c : write .cxx and .h and exit\n -cs : write .cxx and .h and strings and exit\n -o <name> : .cxx output filename, or extension if <name> starts with \'.\'\n -h <name> : .h output filename, or extension if <name> starts with \'.\'\n"
            ,*argv);
    for (iVar11 = 0; iVar1 != iVar11; iVar11 = iVar11 + 1) {
      pFVar7 = Fl_Plugin_Manager::plugin(&pm,iVar11);
      if (pFVar7 != (Fl_Plugin *)0x0) {
        iVar12 = (*pFVar7->_vptr_Fl_Plugin[4])(pFVar7);
        strcat(pcVar10,(char *)CONCAT44(extraout_var_00,iVar12));
      }
    }
    strcat(pcVar10,
           " -bg2 color\n -bg color\n -di[splay] host:n.n\n -dn[d]\n -fg color\n -g[eometry] WxH+X+Y\n -i[conic]\n -k[bd]\n -na[me] classname\n -nod[nd]\n -nok[bd]\n -not[ooltips]\n -s[cheme] scheme\n -ti[tle] windowtitle\n -to[oltips]"
          );
    fprintf(_stderr,"%s\n",pcVar10);
    free(pcVar10);
    Fl_Plugin_Manager::~Fl_Plugin_Manager(&pm);
    return 1;
  }
  if (exit_early != 0) goto LAB_0019bf82;
  c = (Fl_Window *)argv[i];
  fl_register_images();
  make_main_window();
  if (c != (Fl_Window *)0x0) {
    pcVar10 = (char *)c;
    set_filename((char *)c);
  }
  if (batch_mode == 0) {
    Fl::visual(3);
    Fl_File_Icon::load_system_icons();
    w = main_window;
    (main_window->super_Fl_Group).super_Fl_Widget.callback_ = exit_cb;
    position_window(w,"main_window_pos",1,10,0x1e,300,0x20d);
    pacVar9 = (char (*) [2048])(ulong)(uint)argc;
    pcVar10 = (char *)main_window;
    Fl_Window::show(main_window,argc,argv);
    toggle_widgetbin_cb((Fl_Widget *)pcVar10,pacVar9);
    toggle_sourceview_cb((Fl_Double_Window *)pcVar10,pacVar9);
    if (c == (Fl_Window *)0x0) {
      if (((openlast_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') &&
         (absolute_history[0][0] != '\0')) {
        pacVar9 = absolute_history;
        open_history_cb((Fl_Widget *)pcVar10,absolute_history);
      }
      goto LAB_0019bcd9;
    }
    undo_suspend();
LAB_0019bd54:
    pacVar9 = (char (*) [2048])0x0;
    pcVar10 = (char *)c;
    iVar1 = read_file((char *)c,0);
    __stream = _stderr;
    if (iVar1 == 0) {
      if (batch_mode != 0) {
        piVar3 = __errno_location();
        pcVar10 = strerror(*piVar3);
        fprintf(__stream,"%s : %s\n",c,pcVar10);
        exit(1);
      }
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar10 = "Can\'t read %s: %s";
      pacVar9 = (char (*) [2048])c;
      fl_message("Can\'t read %s: %s",c,pcVar4);
    }
  }
  else {
LAB_0019bcd9:
    undo_suspend();
    if (c != (Fl_Window *)0x0) goto LAB_0019bd54;
  }
  undo_resume();
  if (update_file == 0) {
    c = (Fl_Window *)pcVar10;
    if (compile_file == 0) {
      set_modflag(0);
      undo_clear();
      signal(2,sigint);
      ExternalCodeEditor::set_update_timer_callback(external_editor_timer);
      pvVar8 = (void *)0x0;
      __stat_loc = (Fl_Widget *)horizontal_input;
      grid_cb(horizontal_input,0);
      while (quit_flag == 0) {
        Fl::wait(__stat_loc);
      }
      exit_cb(__stat_loc,pvVar8);
      undo_clear();
      return 0;
    }
  }
  else {
    pacVar9 = (char (*) [2048])0x0;
    write_file((char *)c,0);
    if (compile_file == 0) goto LAB_0019bf82;
  }
  if (compile_strings != 0) {
    write_strings_cb((Fl_Widget *)c,pacVar9);
  }
  write_cb((Fl_Widget *)c,pacVar9);
LAB_0019bf82:
  exit(0);
}

Assistant:

int main(int argc,char **argv) {
  int i = 1;
  
  if (!Fl::args(argc,argv,i,arg) || i < argc-1) {
    static const char *msg = 
      "usage: %s <switches> name.fl\n"
      " -u : update .fl file and exit (may be combined with '-c' or '-cs')\n"
      " -c : write .cxx and .h and exit\n"
      " -cs : write .cxx and .h and strings and exit\n"
      " -o <name> : .cxx output filename, or extension if <name> starts with '.'\n"
      " -h <name> : .h output filename, or extension if <name> starts with '.'\n";
    int len = (int)(strlen(msg) + strlen(argv[0]) + strlen(Fl::help));
    Fl_Plugin_Manager pm("commandline");
    int i, n = pm.plugins();
    for (i=0; i<n; i++) {
      Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(i);
      if (pi) len += strlen(pi->help());
    }
    char *buf = (char*)malloc(len+1);
    sprintf(buf, msg, argv[0]);
    for (i=0; i<n; i++) {
      Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(i);
      if (pi) strcat(buf, pi->help());
    }
    strcat(buf, Fl::help);
#ifdef _MSC_VER
    fl_message("%s\n", buf);
#else
    fprintf(stderr, "%s\n", buf);
#endif
    free(buf);
    return 1;
  }
  if (exit_early)
    exit(0);
  
  const char *c = argv[i];

  fl_register_images();

  make_main_window();


  if (c) set_filename(c);
  if (!batch_mode) {
#ifdef __APPLE__
    fl_open_callback(apple_open_cb);
#endif // __APPLE__
    Fl::visual((Fl_Mode)(FL_DOUBLE|FL_INDEX));
    Fl_File_Icon::load_system_icons();
    main_window->callback(exit_cb);
    position_window(main_window,"main_window_pos", 1, 10, 30, WINWIDTH, WINHEIGHT );
    main_window->show(argc,argv);
    toggle_widgetbin_cb(0,0);
    toggle_sourceview_cb(0,0);
    if (!c && openlast_button->value() && absolute_history[0][0]) {
      // Open previous file when no file specified...
      open_history_cb(0, absolute_history[0]);
    }
  }
  undo_suspend();
  if (c && !read_file(c,0)) {
    if (batch_mode) {
      fprintf(stderr,"%s : %s\n", c, strerror(errno));
      exit(1);
    }
    fl_message("Can't read %s: %s", c, strerror(errno));
  }
  undo_resume();

  if (update_file) {		// fluid -u
    write_file(c,0);
    if (!compile_file)
      exit(0);
  }

  if (compile_file) {		// fluid -c[s]
    if (compile_strings)
      write_strings_cb(0,0);
    write_cb(0,0);
    exit(0);
  }
  set_modflag(0);
  undo_clear();
#ifndef WIN32
  signal(SIGINT,sigint);
#endif

  // Set (but do not start) timer callback for external editor updates
  ExternalCodeEditor::set_update_timer_callback(external_editor_timer);

  grid_cb(horizontal_input, 0); // Makes sure that windows get snap params...

#ifdef WIN32
  Fl::run();
#else
  while (!quit_flag) Fl::wait();

  if (quit_flag) exit_cb(0,0);
#endif // WIN32

  undo_clear();

  return (0);
}